

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

Var Js::JavascriptBigInt::Negate(Var aRight)

{
  JavascriptBigInt *pJVar1;
  
  pJVar1 = VarTo<Js::JavascriptBigInt>(aRight);
  pJVar1 = New(pJVar1,(((((pJVar1->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr);
  Negate(pJVar1);
  return pJVar1;
}

Assistant:

Var JavascriptBigInt::Negate(Var aRight)
    {
        JavascriptBigInt* rightBigInt = VarTo<JavascriptBigInt>(aRight);
        JavascriptBigInt* newBigInt = JavascriptBigInt::New(rightBigInt, rightBigInt->GetScriptContext());
        JavascriptBigInt::Negate(newBigInt);
        return newBigInt;
    }